

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_data.cc
# Opt level: O2

int CRYPTO_set_ex_data(CRYPTO_EX_DATA *ad,int idx,void *val)

{
  OPENSSL_STACK *sk;
  size_t sVar1;
  ulong uVar2;
  
  if (idx < 0) {
    abort();
  }
  sk = (OPENSSL_STACK *)ad->sk;
  if (sk == (OPENSSL_STACK *)0x0) {
    sk = OPENSSL_sk_new_null();
    ad->sk = (stack_st_void *)sk;
    if (sk == (OPENSSL_STACK *)0x0) {
      return 0;
    }
  }
  sVar1 = OPENSSL_sk_num(sk);
  uVar2 = sVar1 - 1;
  do {
    uVar2 = uVar2 + 1;
    if ((uint)idx < uVar2) {
      OPENSSL_sk_set((OPENSSL_STACK *)ad->sk,(ulong)(uint)idx,val);
      return 1;
    }
    sVar1 = OPENSSL_sk_push((OPENSSL_STACK *)ad->sk,(void *)0x0);
  } while (sVar1 != 0);
  return 0;
}

Assistant:

int CRYPTO_set_ex_data(CRYPTO_EX_DATA *ad, int index, void *val) {
  if (index < 0) {
    // A caller that can accidentally pass in an invalid index into this
    // function will hit an memory error if |index| happened to be valid, and
    // expected |val| to be of a different type.
    abort();
  }

  if (ad->sk == NULL) {
    ad->sk = sk_void_new_null();
    if (ad->sk == NULL) {
      return 0;
    }
  }

  // Add NULL values until the stack is long enough.
  for (size_t i = sk_void_num(ad->sk); i <= (size_t)index; i++) {
    if (!sk_void_push(ad->sk, NULL)) {
      return 0;
    }
  }

  sk_void_set(ad->sk, (size_t)index, val);
  return 1;
}